

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O1

string * __thiscall
cmCommonTargetGenerator::ComputeTargetCompilePDB
          (string *__return_storage_ptr__,cmCommonTargetGenerator *this,string *config)

{
  TargetType TVar1;
  int iVar2;
  string *psVar3;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  TVar1 = cmGeneratorTarget::GetType(this->GeneratorTarget);
  if ((int)TVar1 < 5) {
    cmGeneratorTarget::GetCompilePDBPath(&local_50,this->GeneratorTarget,config);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (__return_storage_ptr__->_M_string_length == 0) {
      cmGeneratorTarget::GetSupportDirectory_abi_cxx11_(&local_50,this->GeneratorTarget);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      iVar2 = (*(this->GlobalCommonGenerator->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x28]
              )();
      if ((char)iVar2 != '\0') {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)(config->_M_dataplus)._M_p);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      TVar1 = cmGeneratorTarget::GetType(this->GeneratorTarget);
      if (TVar1 == STATIC_LIBRARY) {
        psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(this->GeneratorTarget);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)(psVar3->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCommonTargetGenerator::ComputeTargetCompilePDB(
  const std::string& config) const
{
  std::string compilePdbPath;
  if (this->GeneratorTarget->GetType() > cmStateEnums::OBJECT_LIBRARY) {
    return compilePdbPath;
  }

  compilePdbPath = this->GeneratorTarget->GetCompilePDBPath(config);
  if (compilePdbPath.empty()) {
    // Match VS default: `$(IntDir)vc$(PlatformToolsetVersion).pdb`.
    // A trailing slash tells the toolchain to add its default file name.
    compilePdbPath = this->GeneratorTarget->GetSupportDirectory();
    if (this->GlobalCommonGenerator->IsMultiConfig()) {
      compilePdbPath += "/";
      compilePdbPath += config;
    }
    compilePdbPath += "/";
    if (this->GeneratorTarget->GetType() == cmStateEnums::STATIC_LIBRARY) {
      // Match VS default for static libs: `$(IntDir)$(ProjectName).pdb`.
      compilePdbPath += this->GeneratorTarget->GetName();
      compilePdbPath += ".pdb";
    }
  }

  return compilePdbPath;
}